

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

char * __thiscall asmjit::StringBuilder::prepare(StringBuilder *this,uint32_t op,size_t len)

{
  char *__src;
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  
  if (op == 0) {
    if (len == 0) {
      pcVar2 = "";
      if (this->_data != "") {
        *this->_data = '\0';
        pcVar2 = this->_data;
      }
      this->_length = 0;
      return pcVar2;
    }
    if (this->_capacity < len) {
      if (0xffffffffffffffee < len) {
        return (char *)0x0;
      }
      uVar4 = len + 7 & 0xfffffffffffffff8;
      uVar3 = 0xf8;
      if (0xf8 < uVar4) {
        uVar3 = uVar4;
      }
      pcVar2 = (char *)malloc(uVar3 + 8);
      if (pcVar2 == (char *)0x0) {
        if (this->_data != "") {
          *this->_data = '\0';
        }
        this->_length = 0;
        return (char *)0x0;
      }
      if (this->_canFree != 0) {
        free(this->_data);
      }
      this->_data = pcVar2;
      this->_capacity = uVar3 | 7;
      this->_canFree = 1;
    }
    else {
      pcVar2 = this->_data;
    }
    pcVar2[len] = '\0';
    this->_length = len;
    if (len <= this->_capacity) {
      return this->_data;
    }
  }
  else {
    if (len == 0) {
      return this->_data + this->_length;
    }
    __n = this->_length;
    if (-__n - 0x11 < len) {
      return (char *)0x0;
    }
    uVar3 = this->_capacity;
    uVar4 = len + __n;
    if (uVar3 < uVar4) {
      uVar1 = 0x100;
      if (0x100 < uVar3) {
        uVar1 = uVar3;
      }
      do {
        uVar3 = uVar1;
        if (0xfffff < uVar3) break;
        uVar1 = uVar3 * 2;
      } while (uVar3 < uVar4);
      if ((uVar3 < uVar4) && (uVar3 = uVar4, uVar4 < 0xffffffffffff7fff)) {
        uVar3 = uVar4 + 0x7fff & 0xffffffffffff8000;
      }
      pcVar2 = (char *)malloc((uVar3 + 7 & 0xfffffffffffffff8) + 8);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      __src = this->_data;
      memcpy(pcVar2,__src,__n);
      if (this->_canFree != 0) {
        free(__src);
        __n = this->_length;
      }
      this->_data = pcVar2;
      this->_capacity = uVar3 + 7 | 7;
      this->_canFree = 1;
    }
    else {
      pcVar2 = this->_data;
    }
    pcVar2[uVar4] = '\0';
    this->_length = uVar4;
    if (uVar4 <= this->_capacity) {
      return pcVar2 + __n;
    }
    prepare();
  }
  prepare();
}

Assistant:

ASMJIT_FAVOR_SIZE char* StringBuilder::prepare(uint32_t op, size_t len) noexcept {
  if (op == kStringOpSet) {
    // We don't care here, but we can't return a null pointer since it indicates
    // failure in memory allocation.
    if (len == 0) {
      if (_data != StringBuilder_empty)
        _data[0] = 0;

      _length = 0;
      return _data;
    }

    if (_capacity < len) {
      if (len >= IntTraits<size_t>::maxValue() - sizeof(intptr_t) * 2)
        return nullptr;

      size_t to = Utils::alignTo<size_t>(len, sizeof(intptr_t));
      if (to < 256 - sizeof(intptr_t))
        to = 256 - sizeof(intptr_t);

      char* newData = static_cast<char*>(Internal::allocMemory(to + sizeof(intptr_t)));
      if (!newData) {
        clear();
        return nullptr;
      }

      if (_canFree)
        Internal::releaseMemory(_data);

      _data = newData;
      _capacity = to + sizeof(intptr_t) - 1;
      _canFree = true;
    }

    _data[len] = 0;
    _length = len;

    ASMJIT_ASSERT(_length <= _capacity);
    return _data;
  }
  else {
    // We don't care here, but we can't return a null pointer since it indicates
    // failure of memory allocation.
    if (len == 0)
      return _data + _length;

    // Overflow.
    if (IntTraits<size_t>::maxValue() - sizeof(intptr_t) * 2 - _length < len)
      return nullptr;

    size_t after = _length + len;
    if (_capacity < after) {
      size_t to = _capacity;

      if (to < 256)
        to = 256;

      while (to < 1024 * 1024 && to < after)
        to *= 2;

      if (to < after) {
        to = after;
        if (to < (IntTraits<size_t>::maxValue() - 1024 * 32))
          to = Utils::alignTo<size_t>(to, 1024 * 32);
      }

      to = Utils::alignTo<size_t>(to, sizeof(intptr_t));
      char* newData = static_cast<char*>(Internal::allocMemory(to + sizeof(intptr_t)));
      if (!newData) return nullptr;

      ::memcpy(newData, _data, _length);
      if (_canFree)
        Internal::releaseMemory(_data);

      _data = newData;
      _capacity = to + sizeof(intptr_t) - 1;
      _canFree = true;
    }

    char* ret = _data + _length;
    _data[after] = 0;
    _length = after;

    ASMJIT_ASSERT(_length <= _capacity);
    return ret;
  }
}